

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O0

void __thiscall MemPlumberInternal::MemPlumberInternal(MemPlumberInternal *this)

{
  int local_14;
  int i;
  MemPlumberInternal *this_local;
  
  this->m_Started = false;
  this->m_Verbose = false;
  for (local_14 = 0; local_14 < 0x4000; local_14 = local_14 + 1) {
    this->m_PointerListHashtable[local_14] = (new_ptr_list_t *)0x0;
    this->m_StaticPointerListHashtable[local_14] = (new_ptr_list_t *)0x0;
  }
  this->m_ProgramStarted = -1;
  return;
}

Assistant:

MemPlumberInternal() {
        m_Started = false;
        m_Verbose = false;

        // zero the hashtables
        for (int i = 0; i < MEMPLUMBER_HASHTABLE_SIZE; i++) {
            m_PointerListHashtable[i] = NULL;
            m_StaticPointerListHashtable[i] = NULL;
        }

        #ifdef COLLECT_STATIC_VAR_DATA
        m_ProgramStarted = 0;
        #else
        m_ProgramStarted = -1;
        #endif //COLLECT_STATIC_VAR_DATA
    }